

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::WrapperFieldGenerator::GenerateCodecCode
          (WrapperFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  WrapperFieldGenerator *this_local;
  
  if ((this->is_value_type & 1U) == 0) {
    io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,
                       "pb::FieldCodec.ForClassWrapper<$type_name$>($tag$)");
  }
  else {
    io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,
                       "pb::FieldCodec.ForStructWrapper<$nonnullable_type_name$>($tag$)");
  }
  return;
}

Assistant:

void WrapperFieldGenerator::GenerateCodecCode(io::Printer* printer) {
  if (is_value_type) {
    printer->Print(
      variables_,
      "pb::FieldCodec.ForStructWrapper<$nonnullable_type_name$>($tag$)");
  } else {
    printer->Print(
      variables_,
      "pb::FieldCodec.ForClassWrapper<$type_name$>($tag$)");
  }
}